

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>
::operator()(optimize_functor<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,default_cost_type<long_double> *original_costs,
            double cost_constant)

{
  local_context *ctx;
  context *ctx_00;
  context *ctx_01;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  longdouble in_ST0;
  longdouble theta;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST1;
  longdouble lVar9;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double dVar10;
  compute_order compute;
  solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  slv;
  longdouble local_1a4;
  cost_type local_180;
  longdouble local_170;
  longdouble local_164;
  longdouble local_158;
  longdouble local_14c;
  long local_140;
  double local_138;
  double local_130;
  bit_array_impl local_128;
  compute_order local_118;
  longdouble local_e0;
  longdouble local_d4;
  longdouble local_c8;
  solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  local_b8;
  
  bit_array_impl::bit_array_impl(&local_128,variables);
  ctx_00 = this->m_ctx;
  ctx = &this->m_local_ctx;
  normalize_costs<long_double,baryonyx::itm::default_cost_type<long_double>>
            ((itm *)&local_180,ctx_00,original_costs,&ctx->rng,variables);
  local_158 = (longdouble)(ctx_00->parameters).kappa_step;
  local_14c = (longdouble)(ctx_00->parameters).kappa_max;
  local_164 = (longdouble)(ctx_00->parameters).alpha;
  theta = (longdouble)(ctx_00->parameters).theta;
  dVar10 = (ctx_00->parameters).delta;
  if (0.0 <= dVar10) {
    local_1a4 = (longdouble)dVar10;
    local_130 = dVar10;
  }
  else {
    ctx_01 = this->m_ctx;
    local_b8._0_10_ = theta;
    info<>(ctx_01,"  - delta not defined, compute it:\n");
    local_118.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_10_
         = _DAT_006313d0;
    if (variables != 0) {
      lVar4 = 0;
      do {
        lVar9 = *(longdouble *)
                 ((long)local_180.linear_elements._M_t.
                        super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t
                        .super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                        super__Head_base<0UL,_long_double_*,_false>._M_head_impl + lVar4);
        lVar7 = ABS(lVar9);
        lVar8 = (longdouble)
                local_118.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._0_10_;
        if (lVar7 <= (longdouble)
                     local_118.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._0_10_ ||
            (longdouble)
            local_118.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._0_10_ != lVar7) {
          lVar8 = lVar7;
        }
        if ((longdouble)0 != lVar9) {
          local_118.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _0_10_ = lVar8;
        }
        if (NAN((longdouble)0) || NAN(lVar9)) {
          local_118.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _0_10_ = lVar8;
        }
        lVar4 = lVar4 + 0x10;
        in_ST3 = in_ST2;
        in_ST4 = in_ST2;
        in_ST5 = in_ST2;
      } while ((ulong)(uint)variables << 4 != lVar4);
    }
    local_c8 = (longdouble)
               local_118.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._0_10_ -
               theta * (longdouble)
                       local_118.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._0_10_;
    info<long_double,long_double,long_double>
              (ctx_01,"    - delta={} (min normalized cost:{} / theta: {})\n",&local_c8,
               (longdouble *)&local_118,(longdouble *)&local_b8);
    local_1a4 = local_c8;
  }
  local_d4 = (longdouble)(ctx_00->parameters).pushing_k_factor;
  local_e0 = (longdouble)(ctx_00->parameters).pushing_objective_amplifier;
  local_140 = (long)(ctx_00->parameters).w;
  solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  ::solver_equalities_01coeff
            (&local_b8,&ctx->rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_180,constraints);
  compute_order::compute_order(&local_118,(ctx_00->parameters).order,variables);
  if (((stop_task->_M_base)._M_i & 1U) == 0) {
    bVar6 = false;
    do {
      this->m_call_number = this->m_call_number + 1;
      local_138 = best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                  ::reinit(best_recorder,ctx,bVar6,(ctx_00->parameters).kappa_min,
                           (ctx_00->parameters).kappa_max,(bit_array *)&local_128);
      local_170 = (longdouble)local_138;
      compute_order::
      init<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array>
                (&local_118,&local_b8,(bit_array *)&local_128);
      iVar5 = 0x7fffffff;
      if (((stop_task->_M_base)._M_i & 1U) == 0) {
        lVar4 = 0;
        lVar9 = local_170;
        while (lVar4 != (ctx_00->parameters).limit) {
          iVar1 = compute_order::
                  run<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,long_double>
                            (&local_118,&local_b8,(bit_array *)&local_128,&ctx->rng,lVar9,local_1a4,
                             theta);
          if (iVar1 == 0) {
            dVar10 = default_cost_type<long_double>::results
                               (original_costs,(bit_array *)&local_128,cost_constant);
            best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
            ::try_update(best_recorder,ctx,(bit_array *)&local_128,dVar10,lVar4);
            bVar6 = true;
            goto LAB_00283835;
          }
          if (iVar1 <= iVar5) {
            iVar5 = iVar1;
          }
          if (local_140 < lVar4) {
            powl();
            lVar9 = lVar9 + local_158 * in_ST0;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
          }
          in_ST5 = in_ST4;
          if ((local_14c < lVar9) || (lVar4 = lVar4 + 1, ((stop_task->_M_base)._M_i & 1U) != 0))
          break;
        }
        if (0 < iVar5) goto LAB_00283810;
        bVar6 = false;
LAB_00283835:
        if (((stop_task->_M_base)._M_i & 1U) == 0) {
          iVar5 = 0;
          iVar1 = 0;
          do {
            if ((ctx_00->parameters).pushes_limit <= iVar1) break;
            iVar2 = compute_order::
                    push_and_run<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,long_double>
                              (&local_118,&local_b8,(bit_array *)&local_128,&ctx->rng,local_d4,
                               local_1a4,theta,local_e0);
            if (iVar2 == 0) {
              dVar10 = default_cost_type<long_double>::results
                                 (original_costs,(bit_array *)&local_128,cost_constant);
              best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
              ::try_update(best_recorder,ctx,(bit_array *)&local_128,dVar10,
                           (long)~((ctx_00->parameters).pushing_iteration_limit * iVar1));
              bVar6 = true;
            }
            if (((stop_task->_M_base)._M_i & 1U) == 0) {
              iVar2 = 1;
              lVar9 = local_170;
              while (iVar2 + -1 < (ctx_00->parameters).pushing_iteration_limit) {
                iVar3 = compute_order::
                        run<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,long_double>
                                  (&local_118,&local_b8,(bit_array *)&local_128,&ctx->rng,lVar9,
                                   local_1a4,theta);
                if (iVar3 == 0) {
                  dVar10 = default_cost_type<long_double>::results
                                     (original_costs,(bit_array *)&local_128,cost_constant);
                  best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                  ::try_update(best_recorder,ctx,(bit_array *)&local_128,dVar10,
                               (long)((ctx_00->parameters).pushing_iteration_limit * iVar5 - iVar2))
                  ;
                  bVar6 = true;
                  break;
                }
                if ((ctx_00->parameters).w < (double)(iVar2 + -1)) {
                  powl();
                  lVar9 = lVar9 + local_158 * in_ST0;
                  in_ST0 = in_ST1;
                  in_ST1 = in_ST2;
                  in_ST2 = in_ST3;
                  in_ST3 = in_ST4;
                  in_ST4 = in_ST5;
                }
                in_ST5 = in_ST4;
                if ((local_14c < lVar9) ||
                   (iVar2 = iVar2 + 1, ((stop_task->_M_base)._M_i & 1U) != 0)) break;
              }
            }
            iVar1 = iVar1 + 1;
            iVar5 = iVar5 + -1;
          } while (((stop_task->_M_base)._M_i & 1U) == 0);
        }
      }
      else {
LAB_00283810:
        best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
        ::try_advance(best_recorder,ctx,(bit_array *)&local_128,iVar5,(ctx_00->parameters).limit);
        bVar6 = false;
      }
    } while (((stop_task->_M_base)._M_i & 1U) == 0);
  }
  if (local_118.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  ::~solver_equalities_01coeff(&local_b8);
  if ((_Head_base<0UL,_long_double_*,_false>)
      local_180.linear_elements._M_t.
      super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
      super__Head_base<0UL,_long_double_*,_false>._M_head_impl !=
      (_Head_base<0UL,_long_double_*,_false>)0x0) {
    operator_delete__((void *)local_180.linear_elements._M_t.
                              super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                              .super__Head_base<0UL,_long_double_*,_false>._M_head_impl);
  }
  if (local_128.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)local_128.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }